

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O0

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,size_t max_items)

{
  size_t in_RDI;
  circular_q<spdlog::details::async_msg> *unaff_retaddr;
  size_t max_items_00;
  
  max_items_00 = in_RDI;
  std::mutex::mutex((mutex *)0x21771d);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x28));
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x58));
  circular_q<spdlog::details::async_msg>::circular_q(unaff_retaddr,max_items_00);
  return;
}

Assistant:

explicit mpmc_blocking_queue(size_t max_items)
        : q_(max_items)
    {}